

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_dsc.c
# Opt level: O2

int get_dsc_leb_entries(Dwarf_Debug dbg,Dwarf_Small *blockpointer,Dwarf_Unsigned blocklen,
                       int dounsigned,Dwarf_Dsc_Entry_s *ary,size_t *arraycount,Dwarf_Error *error)

{
  size_t sVar1;
  Dwarf_Unsigned DVar2;
  int iVar3;
  Dwarf_Unsigned DVar4;
  char *msg;
  Dwarf_Unsigned *pDVar5;
  Dwarf_Small *pDVar6;
  ulong uVar7;
  Dwarf_Unsigned DVar8;
  Dwarf_Small *pDVar9;
  Dwarf_Signed *pDVar10;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Debug local_60;
  Dwarf_Small *local_58;
  ulong local_50;
  ulong local_48;
  Dwarf_Dsc_Entry_s *local_40;
  ulong *local_38;
  
  sVar1 = *arraycount;
  if (ary == (Dwarf_Dsc_Entry_s *)0x0) {
    if (sVar1 != 0) goto LAB_001afab9;
  }
  else if (sVar1 == 0) goto LAB_001afab9;
  pDVar9 = blockpointer + blocklen;
  local_60 = dbg;
  local_48 = sVar1;
  local_40 = ary;
  local_38 = arraycount;
  if (dounsigned == 0) {
    pDVar10 = &ary->dsc_high_s;
    uVar7 = 0;
    while( true ) {
      if (pDVar9 <= blockpointer) break;
      dbg = local_60;
      if (local_48 <= uVar7 && local_40 != (Dwarf_Dsc_Entry_s *)0x0) goto LAB_001afab9;
      lu_leblen = 0;
      lu_local = 0;
      local_50 = uVar7;
      iVar3 = dwarf_decode_signed_leb128
                        ((char *)blockpointer,&lu_leblen,(Dwarf_Signed *)&lu_local,(char *)pDVar9);
      DVar2 = lu_local;
      if (iVar3 == 1) {
LAB_001afac0:
        msg = "DW_DLE_LEB_IMPROPER: decode sleb w/len  runs past allowed area.f";
        goto LAB_001afac7;
      }
      pDVar6 = blockpointer + lu_leblen;
      if (lu_local != 0) {
        lu_leblen = 0;
        lu_local = 0;
        iVar3 = dwarf_decode_signed_leb128
                          ((char *)pDVar6,&lu_leblen,(Dwarf_Signed *)&lu_local,(char *)pDVar9);
        DVar8 = lu_local;
        if (iVar3 != 1) {
          pDVar6 = pDVar6 + lu_leblen;
          lu_leblen = 0;
          lu_local = 0;
          iVar3 = dwarf_decode_signed_leb128
                            ((char *)pDVar6,&lu_leblen,(Dwarf_Signed *)&lu_local,(char *)pDVar9);
          if (iVar3 != 1) {
            blockpointer = pDVar6 + lu_leblen;
            DVar4 = lu_local;
            goto LAB_001afa66;
          }
        }
        goto LAB_001afac0;
      }
      lu_leblen = 0;
      lu_local = 0;
      iVar3 = dwarf_decode_signed_leb128
                        ((char *)pDVar6,&lu_leblen,(Dwarf_Signed *)&lu_local,(char *)pDVar9);
      if (iVar3 == 1) goto LAB_001afac0;
      blockpointer = pDVar6 + lu_leblen;
      DVar4 = 0;
      DVar8 = lu_local;
LAB_001afa66:
      if (local_40 != (Dwarf_Dsc_Entry_s *)0x0) {
        ((Dwarf_Dsc_Entry_s *)(pDVar10 + -4))->dsc_type = (Dwarf_Half)DVar2;
        pDVar10[-1] = DVar8;
        *pDVar10 = DVar4;
      }
      uVar7 = local_50 + 1;
      pDVar10 = pDVar10 + 5;
    }
  }
  else {
    pDVar5 = &ary->dsc_high_u;
    uVar7 = 0;
    local_58 = pDVar9;
    while( true ) {
      if (local_58 <= blockpointer) break;
      dbg = local_60;
      if (local_48 <= uVar7 && local_40 != (Dwarf_Dsc_Entry_s *)0x0) goto LAB_001afab9;
      lu_leblen = 0;
      lu_local = 0;
      local_50 = uVar7;
      iVar3 = dwarf_decode_leb128((char *)blockpointer,&lu_leblen,&lu_local,(char *)local_58);
      pDVar9 = local_58;
      DVar2 = lu_local;
      if (iVar3 == 1) goto LAB_001afa92;
      pDVar6 = blockpointer + lu_leblen;
      if (lu_local == 0) {
        lu_leblen = 0;
        lu_local = 0;
        iVar3 = dwarf_decode_leb128((char *)pDVar6,&lu_leblen,&lu_local,(char *)local_58);
        if (iVar3 == 1) goto LAB_001afa92;
        blockpointer = pDVar6 + lu_leblen;
        DVar4 = 0;
        DVar8 = lu_local;
      }
      else {
        lu_leblen = 0;
        lu_local = 0;
        iVar3 = dwarf_decode_leb128((char *)pDVar6,&lu_leblen,&lu_local,(char *)local_58);
        DVar8 = lu_local;
        if (iVar3 == 1) {
LAB_001afa92:
          msg = "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c";
LAB_001afac7:
          _dwarf_error_string(local_60,error,0x149,msg);
          return 1;
        }
        pDVar6 = pDVar6 + lu_leblen;
        lu_leblen = 0;
        lu_local = 0;
        iVar3 = dwarf_decode_leb128((char *)pDVar6,&lu_leblen,&lu_local,(char *)pDVar9);
        if (iVar3 == 1) goto LAB_001afa92;
        blockpointer = pDVar6 + lu_leblen;
        DVar4 = lu_local;
      }
      if (local_40 != (Dwarf_Dsc_Entry_s *)0x0) {
        ((Dwarf_Dsc_Entry_s *)(pDVar5 + -2))->dsc_type = (Dwarf_Half)DVar2;
        pDVar5[-1] = DVar8;
        *pDVar5 = DVar4;
      }
      uVar7 = local_50 + 1;
      pDVar5 = pDVar5 + 5;
    }
  }
  if (local_40 == (Dwarf_Dsc_Entry_s *)0x0) {
    *local_38 = uVar7;
    return 0;
  }
  dbg = local_60;
  if (local_48 == uVar7) {
    return 0;
  }
LAB_001afab9:
  _dwarf_error(dbg,error,0x161);
  return 1;
}

Assistant:

static int
get_dsc_leb_entries(Dwarf_Debug dbg,
    Dwarf_Small    * blockpointer,
    Dwarf_Unsigned   blocklen,
    int dounsigned,
    struct Dwarf_Dsc_Entry_s *ary,
    size_t         * arraycount,
    Dwarf_Error    * error)
{
    Dwarf_Small *p = blockpointer;
    Dwarf_Small *endp = blockpointer + blocklen;
    size_t larraycount = 0;
    size_t iarraycount = *arraycount;

    if (!ary) {
        if (iarraycount) {
            /* Internal botch calling this static function. */
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        } else {}
    } else {
        if (!iarraycount) {
            /* Internal botch calling this static function. */
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        } else {}
    }
    if (dounsigned) {
        while (p < endp)  {
            Dwarf_Unsigned dsc = 0;
            Dwarf_Unsigned low = 0;
            Dwarf_Unsigned high = 0;

            if (ary && (larraycount >= iarraycount)) {
                _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
                return DW_DLV_ERROR;
            }
            DECODE_LEB128_UWORD_CK(p,dsc,
                dbg,error,endp);
            if (!dsc) {
                DECODE_LEB128_UWORD_CK(p,low,
                    dbg,error,endp);
            } else {
                DECODE_LEB128_UWORD_CK(p,low,
                    dbg,error,endp);
                DECODE_LEB128_UWORD_CK(p,high,
                    dbg,error,endp);
            }
            if (ary) {
                struct Dwarf_Dsc_Entry_s *arye =
                    ary+larraycount;

                /*  type reads the same as uleb and leb because
                    it is only zero or one. */
                arye->dsc_type = (Dwarf_Half)dsc;
                arye->dsc_low_u = low;
                arye->dsc_high_u = high;
            }
            larraycount++;
        }
    } else {
        while (p < endp)  {
            Dwarf_Signed dsc = 0;
            Dwarf_Signed low = 0;
            Dwarf_Signed high = 0;
            Dwarf_Unsigned leblen = 0;

            (void)leblen;
            if (ary && (larraycount >= iarraycount)) {
                _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
                return DW_DLV_ERROR;
            }
            DECODE_LEB128_SWORD_LEN_CK(p,dsc,
                leblen,dbg,error,endp);
            if (!dsc) {
                DECODE_LEB128_SWORD_LEN_CK(p,low,
                    leblen,dbg,error,endp);
            } else {
                DECODE_LEB128_SWORD_LEN_CK(p,low,
                    leblen,dbg,error,endp);
                DECODE_LEB128_SWORD_LEN_CK(p,high,
                    leblen,dbg,error,endp);
            }
            if (ary) {
                struct Dwarf_Dsc_Entry_s *arye =
                    ary+larraycount;

                /*  type reads the same as uleb and leb because
                    it is only zero or one. */
                arye->dsc_type = (Dwarf_Half)dsc;
                arye->dsc_low_s = low;
                arye->dsc_high_s = high;
            }
            larraycount++;
        }
    }
    if (ary) {
        /*  Just verify this recount matches original */
        if (iarraycount != larraycount) {
            _dwarf_error(dbg, error, DW_DLE_DISCR_ARRAY_ERROR);
            return DW_DLV_ERROR;
        }
    } else {
        /*  This matters for first call with
            ary 0 and iarraycount 0 as we are generating the
            count. */
        *arraycount = larraycount;
    }
    return DW_DLV_OK;
}